

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

uint8_t * Decode(WEBP_CSP_MODE mode,uint8_t *data,size_t data_size,int *width,int *height,
                WebPDecBuffer *keep_info)

{
  int iVar1;
  VP8StatusCode VVar2;
  WebPDecParams *in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  WEBP_CSP_MODE in_EDI;
  undefined4 *in_R8;
  long in_R9;
  WebPDecBuffer output;
  WebPDecParams params;
  WebPDecBuffer *in_stack_fffffffffffffed8;
  WEBP_CSP_MODE WVar3;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 local_118;
  uint8_t *local_110;
  int *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  uint8_t *in_stack_ffffffffffffff18;
  uint8_t *local_8;
  
  iVar1 = WebPInitDecBuffer((WebPDecBuffer *)0x118610);
  if (iVar1 == 0) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    WebPResetDecParams((WebPDecParams *)0x118633);
    WVar3 = in_EDI;
    iVar1 = WebPGetInfo(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                        in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (iVar1 == 0) {
      local_8 = (uint8_t *)0x0;
    }
    else {
      if (in_RCX != (WebPDecParams *)0x0) {
        *(undefined4 *)&in_RCX->output = in_stack_fffffffffffffee4;
      }
      if (in_R8 != (undefined4 *)0x0) {
        *in_R8 = local_118;
      }
      VVar2 = DecodeInto(in_RSI,in_RDX,in_RCX);
      if (VVar2 == VP8_STATUS_OK) {
        if (in_R9 != 0) {
          WebPCopyDecBuffer((WebPDecBuffer *)CONCAT44(in_stack_fffffffffffffee4,WVar3),
                            in_stack_fffffffffffffed8);
        }
        WebPIsRGBMode(in_EDI);
        local_8 = local_110;
      }
      else {
        local_8 = (uint8_t *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

WEBP_NODISCARD static uint8_t* Decode(WEBP_CSP_MODE mode,
                                      const uint8_t* const data,
                                      size_t data_size, int* const width,
                                      int* const height,
                                      WebPDecBuffer* const keep_info) {
  WebPDecParams params;
  WebPDecBuffer output;

  if (!WebPInitDecBuffer(&output)) {
    return NULL;
  }
  WebPResetDecParams(&params);
  params.output = &output;
  output.colorspace = mode;

  // Retrieve (and report back) the required dimensions from bitstream.
  if (!WebPGetInfo(data, data_size, &output.width, &output.height)) {
    return NULL;
  }
  if (width != NULL) *width = output.width;
  if (height != NULL) *height = output.height;

  // Decode
  if (DecodeInto(data, data_size, &params) != VP8_STATUS_OK) {
    return NULL;
  }
  if (keep_info != NULL) {    // keep track of the side-info
    WebPCopyDecBuffer(&output, keep_info);
  }
  // return decoded samples (don't clear 'output'!)
  return WebPIsRGBMode(mode) ? output.u.RGBA.rgba : output.u.YUVA.y;
}